

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.h
# Opt level: O2

uint * __thiscall Gluco::Queue<unsigned_int>::operator[](Queue<unsigned_int> *this,int index)

{
  int iVar1;
  int iVar2;
  char *__assertion;
  int iVar3;
  
  if (index < 0) {
    __assertion = "index >= 0";
  }
  else {
    iVar1 = (this->buf).sz;
    iVar2 = this->first;
    iVar3 = 0;
    if (this->end < iVar2) {
      iVar3 = iVar1;
    }
    if (index < (this->end - iVar2) + iVar3) {
      return (this->buf).data + (iVar2 + index) % iVar1;
    }
    __assertion = "index < size()";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Queue.h"
                ,0x2f,"T &Gluco::Queue<unsigned int>::operator[](int) [T = unsigned int]");
}

Assistant:

T&       operator [] (int index)        { assert(index >= 0); assert(index < size()); return buf[(first + index) % buf.size()]; }